

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O0

void __thiscall slang::ast::DeclaredType::resolveAt(DeclaredType *this,ASTContext *context)

{
  SourceLocation startLoc;
  bool bVar1;
  Symbol *pSVar2;
  EnumType *pEVar3;
  SourceLocation endLoc;
  Expression *pEVar4;
  Type *in_RSI;
  underlying_type in_RDI;
  SourceRange in_stack_00000000;
  Type *targetType;
  bitmask<slang::ast::ASTFlags> extraFlags;
  Scope *scope;
  DeclaredType *in_stack_000000a0;
  ASTContext *in_stack_000001d0;
  ASTContext *in_stack_000001d8;
  DeclaredType *in_stack_000001e0;
  bitmask<slang::ast::DeclaredTypeFlags> *in_stack_ffffffffffffff38;
  bitmask<slang::ast::DeclaredTypeFlags> *in_stack_ffffffffffffff40;
  SourceRange local_88;
  bitmask<slang::ast::ASTFlags> local_78;
  bitmask<slang::ast::DeclaredTypeFlags> local_6c;
  bitmask<slang::ast::ASTFlags> local_68;
  Type *local_60;
  bitmask<slang::ast::ASTFlags> local_58;
  Scope *local_50;
  ASTContext *in_stack_ffffffffffffffe0;
  ExpressionSyntax *in_stack_ffffffffffffffe8;
  bitmask<slang::ast::ASTFlags> extraFlags_00;
  
  extraFlags_00.m_bits = in_RDI;
  if (*(long *)(in_RDI + 8) == 0) {
    getASTContext<false,slang::ast::ASTContext>(in_stack_000000a0);
    resolveType(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    if (*(long *)(in_RDI + 0x20) != 0) {
      return;
    }
  }
  if (*(long *)(in_RDI + 0x28) == 0) {
    *(undefined8 *)(in_RDI + 0x20) = NoInitializer;
  }
  else {
    local_50 = not_null<const_slang::ast::Scope_*>::operator*
                         ((not_null<const_slang::ast::Scope_*> *)0x10eef18);
    bitmask<slang::ast::ASTFlags>::bitmask(&local_58);
    local_60 = *(Type **)(in_RDI + 8);
    bVar1 = Type::isEnum((Type *)0x10eef3f);
    if ((bVar1) && (pSVar2 = Scope::asSymbol(local_50), pSVar2->kind == EnumType)) {
      pEVar3 = Symbol::as<slang::ast::EnumType>((Symbol *)0x10eef5e);
      local_60 = pEVar3->baseType;
      bitmask<slang::ast::ASTFlags>::bitmask(&local_68,UnevaluatedBranch);
      local_58.m_bits = local_68.m_bits;
    }
    else {
      bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_6c,AllowUnboundedLiteral);
      bVar1 = bitmask<slang::ast::DeclaredTypeFlags>::has
                        (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      if (bVar1) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_78,AllowUnboundedLiteral);
        local_58.m_bits = local_78.m_bits;
      }
    }
    startLoc = *(SourceLocation *)(in_RDI + 0x30);
    endLoc = SourceLocation::operator+<int>
                       (*(SourceLocation **)(in_RDI + 0x28),(int)((ulong)local_60 >> 0x20));
    SourceRange::SourceRange(&local_88,startLoc,endLoc);
    pEVar4 = Expression::bindRValue
                       (in_RSI,in_stack_ffffffffffffffe8,in_stack_00000000,in_stack_ffffffffffffffe0
                        ,extraFlags_00);
    *(Expression **)(in_RDI + 0x20) = pEVar4;
  }
  return;
}

Assistant:

void DeclaredType::resolveAt(const ASTContext& context) const {
    if (!type) {
        resolveType(getASTContext<false>(), context);
        if (initializer)
            return;
    }

    if (!initializerSyntax) {
        initializer = NoInitializer;
        return;
    }

    // Enums are special in that their initializers target the base type of the enum
    // instead of the actual enum type (which doesn't allow implicit conversions from
    // normal integral values).
    auto& scope = *context.scope;
    bitmask<ASTFlags> extraFlags;
    const Type* targetType = type;
    if (targetType->isEnum() && scope.asSymbol().kind == SymbolKind::EnumType) {
        targetType = &targetType->as<EnumType>().baseType;
        extraFlags = ASTFlags::UnevaluatedBranch;
    }
    else if (flags.has(DeclaredTypeFlags::AllowUnboundedLiteral)) {
        extraFlags = ASTFlags::AllowUnboundedLiteral;
    }

    initializer = &Expression::bindRValue(*targetType, *initializerSyntax,
                                          {initializerLocation, initializerLocation + 1}, context,
                                          extraFlags);
}